

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpeg2StreamReader.cpp
# Opt level: O1

CheckStreamRez * __thiscall
MPEG2StreamReader::checkStream
          (CheckStreamRez *__return_storage_ptr__,MPEG2StreamReader *this,uint8_t *buffer,int len)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  string *psVar3;
  string *psVar4;
  string *this_00;
  byte *end;
  byte bVar5;
  long *plVar6;
  pointer pcVar7;
  bool bVar8;
  bool bVar9;
  byte bVar10;
  bool bVar11;
  byte bVar12;
  uint uVar13;
  long lVar14;
  uint8_t *puVar15;
  byte *pbVar16;
  bool bVar17;
  byte *pbVar18;
  byte *pbVar19;
  byte *pbVar20;
  bool bVar21;
  BitStreamReader bitReader;
  MPEGPictureHeader frame;
  BitStreamReader local_110;
  byte *local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  string local_d0;
  MPEGPictureHeader local_b0;
  
  (__return_storage_ptr__->codecInfo).codecID = 0;
  paVar1 = &(__return_storage_ptr__->codecInfo).displayName.field_2;
  (__return_storage_ptr__->codecInfo).displayName._M_dataplus._M_p = (pointer)paVar1;
  (__return_storage_ptr__->codecInfo).displayName._M_string_length = 0;
  (__return_storage_ptr__->codecInfo).displayName.field_2._M_local_buf[0] = '\0';
  paVar2 = &(__return_storage_ptr__->codecInfo).programName.field_2;
  (__return_storage_ptr__->codecInfo).programName._M_dataplus._M_p = (pointer)paVar2;
  (__return_storage_ptr__->codecInfo).programName._M_string_length = 0;
  (__return_storage_ptr__->codecInfo).programName.field_2._M_local_buf[0] = '\0';
  local_d8 = &(__return_storage_ptr__->streamDescr).field_2;
  (__return_storage_ptr__->streamDescr)._M_dataplus._M_p = (pointer)local_d8;
  (__return_storage_ptr__->streamDescr)._M_string_length = 0;
  (__return_storage_ptr__->streamDescr).field_2._M_local_buf[0] = '\0';
  local_e0 = &(__return_storage_ptr__->lang).field_2;
  (__return_storage_ptr__->lang)._M_dataplus._M_p = (pointer)local_e0;
  (__return_storage_ptr__->lang)._M_string_length = 0;
  (__return_storage_ptr__->lang).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->trackID = 0;
  __return_storage_ptr__->delay = 0;
  *(undefined4 *)((long)&__return_storage_ptr__->delay + 7) = 0;
  local_110.super_BitStream.m_totalBits = 0;
  local_110.super_BitStream.m_buffer = (uint *)0x0;
  local_110.super_BitStream.m_initBuffer = (uint *)0x0;
  local_110.m_curVal = 0;
  local_110.m_bitLeft = 0;
  MPEGPictureHeader::MPEGPictureHeader(&local_b0,0);
  end = buffer + len;
  pbVar20 = end;
  if (2 < len) {
    pbVar18 = buffer + 2;
    do {
      lVar14 = 3;
      if (*pbVar18 < 2) {
        if (*pbVar18 == 0) {
          lVar14 = 1;
        }
        else if ((pbVar18[-2] == 0) && (pbVar18[-1] == 0)) {
          pbVar20 = pbVar18 + -2;
          break;
        }
      }
      pbVar18 = pbVar18 + lVar14;
    } while (pbVar18 < end);
  }
  pbVar18 = end + -0x20;
  bVar9 = pbVar18 < pbVar20;
  local_e8 = paVar2;
  if (pbVar18 < pbVar20) {
    bVar17 = false;
    bVar10 = 1;
    bVar12 = 1;
    bVar11 = false;
  }
  else {
    local_f0 = end + -4;
    bVar11 = false;
    bVar17 = false;
    bVar12 = 0;
    bVar10 = 0;
    do {
      bVar5 = pbVar20[3];
      bVar8 = true;
      if ((byte)(bVar5 - 1) < 0xaf) {
        bVar10 = 1;
      }
      else {
        switch(bVar5) {
        case 0xb2:
        case 0xb7:
        case 0xb8:
          break;
        case 0xb3:
          for (pbVar19 = pbVar20 + 6; pbVar16 = end, pbVar19 < end; pbVar19 = pbVar19 + lVar14) {
            lVar14 = 3;
            if (*pbVar19 < 2) {
              if (*pbVar19 == 0) {
                lVar14 = 1;
              }
              else if ((pbVar19[-2] == 0) && (pbVar19[-1] == 0)) {
                pbVar16 = pbVar19 + -2;
                break;
              }
            }
          }
          puVar15 = MPEGSequenceHeader::deserialize
                              (&this->m_sequence,pbVar20 + 4,
                               (int64_t)(pbVar16 + (-4 - (long)pbVar20)));
          if (puVar15 == (uint8_t *)0x0) goto switchD_001bdbaa_caseD_b4;
          (this->super_MPEGStreamReader).m_streamAR = (uint)(this->m_sequence).aspect_ratio_info;
          this->spsFound = true;
          bVar8 = true;
          break;
        case 0xb4:
        case 0xb6:
switchD_001bdbaa_caseD_b4:
          bVar11 = true;
          bVar8 = false;
          break;
        case 0xb5:
          BitStream::setBuffer(&local_110.super_BitStream,pbVar20 + 4,end);
          local_110._24_8_ = local_110._24_8_ & 0xffffffff;
          local_110.m_curVal =
               BitStreamReader::getCurVal(&local_110,local_110.super_BitStream.m_buffer);
          local_110.m_bitLeft = 0x20;
          uVar13 = BitStreamReader::getBits(&local_110,4);
          if ((char)uVar13 == '\b') {
            MPEGPictureHeader::deserializeCodingExtension(&local_b0,&local_110);
            bVar17 = (bool)(bVar17 | local_b0.repeat_first_field != '\0');
          }
          else if ((uVar13 & 0xff) == 1) {
            MPEGSequenceHeader::deserializeExtension(&this->m_sequence,&local_110);
          }
          break;
        default:
          if (bVar5 != 0) goto switchD_001bdbaa_caseD_b4;
          puVar15 = MPEGPictureHeader::deserialize
                              (&local_b0,pbVar20 + 4,(long)local_f0 - (long)pbVar20);
          bVar21 = puVar15 == (uint8_t *)0x0;
          bVar8 = !bVar21;
          if (!bVar21) {
            bVar12 = 1;
          }
          bVar11 = (bool)(bVar11 | bVar21);
        }
      }
      if (!bVar8) break;
      for (pbVar19 = pbVar20 + 6; pbVar20 = end, pbVar19 < end; pbVar19 = pbVar19 + lVar14) {
        lVar14 = 3;
        if (*pbVar19 < 2) {
          if (*pbVar19 == 0) {
            lVar14 = 1;
          }
          else if ((pbVar19[-2] == 0) && (pbVar19[-1] == 0)) {
            pbVar20 = pbVar19 + -2;
            break;
          }
        }
      }
      bVar9 = pbVar18 < pbVar20;
    } while (pbVar20 <= pbVar18);
    bVar12 = bVar12 ^ 1;
    bVar10 = bVar10 ^ 1;
  }
  psVar3 = &(__return_storage_ptr__->codecInfo).displayName;
  psVar4 = &(__return_storage_ptr__->codecInfo).programName;
  this_00 = &__return_storage_ptr__->streamDescr;
  if (bVar9) {
    if (!(bool)(bVar12 | bVar10) && (~this->spsFound & 1U) == 0) {
      (__return_storage_ptr__->codecInfo).codecID = ::mpeg2CodecInfo.codecID;
      std::__cxx11::string::_M_assign((string *)psVar3);
      std::__cxx11::string::_M_assign((string *)psVar4);
      MPEGSequenceHeader::getStreamDescr_abi_cxx11_(&local_d0,&this->m_sequence);
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if (bVar17) {
        std::__cxx11::string::append((char *)this_00);
      }
    }
    MPEGRawDataHeader::~MPEGRawDataHeader(&local_b0.super_MPEGRawDataHeader);
  }
  else {
    MPEGRawDataHeader::~MPEGRawDataHeader(&local_b0.super_MPEGRawDataHeader);
    if (!bVar11) {
      plVar6 = (long *)(__return_storage_ptr__->lang)._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar6 != local_e0) {
        operator_delete(plVar6,local_e0->_M_allocated_capacity + 1);
      }
      paVar2 = local_e8;
      plVar6 = (long *)(this_00->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar6 != local_d8) {
        operator_delete(plVar6,local_d8->_M_allocated_capacity + 1);
      }
      plVar6 = (long *)(psVar4->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar6 != paVar2) {
        operator_delete(plVar6,paVar2->_M_allocated_capacity + 1);
      }
      pcVar7 = (psVar3->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar7 != paVar1) {
        operator_delete(pcVar7,paVar1->_M_allocated_capacity + 1);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

CheckStreamRez MPEG2StreamReader::checkStream(uint8_t* buffer, int len)
{
    CheckStreamRez rez;
    uint8_t* end = buffer + len;
    BitStreamReader bitReader{};
    uint8_t* nextNal = nullptr;
    bool sliceFound = false;
    bool pictureFound = false;
    bool pulldownFound = false;
    uint8_t extType = 0;
    MPEGPictureHeader frame(0);
    for (uint8_t* nal = MPEGHeader::findNextMarker(buffer, end); nal <= end - 32;
         nal = MPEGHeader::findNextMarker(nal + 4, end))
    {
        uint8_t unitType = nal[3];
        try
        {
            if (unitType >= SLICE_MIN_START_SHORT_CODE && unitType <= SLICE_MAX_START_SHORT_CODE)
                sliceFound = true;
            else
                switch (unitType)
                {
                case EXT_START_SHORT_CODE:
                    bitReader.setBuffer(nal + 4, end);
                    extType = bitReader.getBits<uint8_t>(4);
                    if (extType == SEQUENCE_EXT)
                    {
                        m_sequence.deserializeExtension(bitReader);
                    }
                    else if (extType == PICTURE_CODING_EXT)
                    {
                        frame.deserializeCodingExtension(bitReader);
                        pulldownFound |= frame.repeat_first_field > 0;
                    }
                    break;
                case SEQ_END_SHORT_CODE:
                case GOP_START_SHORT_CODE:
                case USER_START_SHORT_CODE:
                    break;
                case PICTURE_START_SHORT_CODE:
                    if (frame.deserialize(nal + 4, end - nal - 4) == nullptr)
                        return rez;
                    pictureFound = true;
                    break;
                case SEQ_START_SHORT_CODE:
                    nextNal = MPEGHeader::findNextMarker(nal + 4, end);
                    if (m_sequence.deserialize(nal + 4, nextNal - nal - 4) == nullptr)
                        return rez;
                    m_streamAR = static_cast<VideoAspectRatio>(m_sequence.aspect_ratio_info);
                    spsFound = true;
                    break;
                default:
                    return rez;
                }
        }
        catch (BitStreamException& e)
        {
            (void)e;
            // return rez;
        }
    }
    if (spsFound && pictureFound && sliceFound)
    {
        rez.codecInfo = mpeg2CodecInfo;
        rez.streamDescr = m_sequence.getStreamDescr();
        if (pulldownFound)
            rez.streamDescr += " (pulldown)";
    }
    return rez;
}